

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::XFormWidget::updateGeometry(XFormWidget *this)

{
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *this_00;
  double dVar1;
  HalfedgeElement *pHVar2;
  pointer pVVar3;
  double dVar4;
  bool bVar5;
  Joint *this_01;
  long lVar6;
  SceneObject *pSVar7;
  double *pdVar8;
  BBox *pBVar9;
  byte bVar10;
  double local_78;
  double dStack_70;
  double local_68;
  
  bVar10 = 0;
  if ((this->target).object == (SceneObject *)0x0) {
    return;
  }
  this_00 = &this->axes;
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize(this_00,3);
  if (this->objectMode != true) {
    pHVar2 = (this->target).element;
    if (pHVar2 == (HalfedgeElement *)0x0) {
      return;
    }
    if (this->transformedMode == true) {
      (**pHVar2->_vptr_HalfedgeElement)(&local_78);
      pSVar7 = (this->target).object;
      dVar1 = (pSVar7->position).z;
      dVar4 = (pSVar7->position).y;
      (this->center).x = (pSVar7->position).x + local_78;
      (this->center).y = dVar4 + dStack_70;
      (this->center).z = local_68 + dVar1;
    }
    else {
      (**pHVar2->_vptr_HalfedgeElement)(&local_78);
      (this->center).z = local_68;
      (this->center).x = local_78;
      (this->center).y = dStack_70;
    }
    (*((this->target).element)->_vptr_HalfedgeElement[1])(&local_78);
    pdVar8 = &local_78;
    pBVar9 = &this->bounds;
    for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pBVar9->max).x = *pdVar8;
      pdVar8 = pdVar8 + (ulong)bVar10 * -2 + 1;
      pBVar9 = (BBox *)((long)pBVar9 + (ulong)bVar10 * -0x10 + 8);
    }
    pHVar2 = (this->target).element;
    (*pHVar2->_vptr_HalfedgeElement[2])(pHVar2,this_00);
    return;
  }
  pSVar7 = (this->target).object;
  if ((pSVar7 == (SceneObject *)0x0) ||
     (this_01 = (Joint *)__dynamic_cast(pSVar7,&SceneObject::typeinfo,&Joint::typeinfo,0),
     this_01 == (Joint *)0x0)) {
    (this->center).z = (pSVar7->position).z;
    dVar1 = (pSVar7->position).y;
    (this->center).x = (pSVar7->position).x;
    (this->center).y = dVar1;
    bVar5 = true;
    this_01 = (Joint *)0x0;
  }
  else {
    Joint::getBasePosInWorld(this_01);
    (this->center).z = local_68;
    (this->center).x = local_78;
    (this->center).y = dStack_70;
    bVar5 = false;
  }
  if (this->jointMode == false) {
    pSVar7 = (this->target).object;
  }
  else {
    pSVar7 = (this->target).object;
    if (this->jointIsRoot == true) {
      if ((pSVar7 == (SceneObject *)0x0) ||
         (lVar6 = __dynamic_cast(pSVar7,&SceneObject::typeinfo,&Joint::typeinfo,0), lVar6 == 0))
      goto LAB_0017f348;
      pSVar7 = *(SceneObject **)(*(long *)(lVar6 + 0x140) + 0xf0);
    }
  }
  (*pSVar7->_vptr_SceneObject[4])(&local_78);
  pdVar8 = &local_78;
  pBVar9 = &this->bounds;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pBVar9->max).x = *pdVar8;
    pdVar8 = pdVar8 + (ulong)bVar10 * -2 + 1;
    pBVar9 = (BBox *)((long)pBVar9 + (ulong)bVar10 * -0x10 + 8);
  }
LAB_0017f348:
  if (bVar5) {
    pVVar3 = (this_00->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar3->x = 1.0;
    pVVar3[1].x = 0.0;
    pVVar3->y = 0.0;
    pVVar3->z = 0.0;
    pVVar3[1].y = 1.0;
    pVVar3[1].z = 0.0;
    pVVar3[2].x = 0.0;
    pVVar3[2].y = 0.0;
    pVVar3[2].z = 1.0;
  }
  else {
    Joint::getAxes(this_01,this_00);
  }
  return;
}

Assistant:

void XFormWidget::updateGeometry()
{
  if (target.object == nullptr) return;

   axes.resize(3);
   if (objectMode) {
     Joint* joint = dynamic_cast<Joint*>(target.object);
     if (joint != nullptr)
       center = joint->getBasePosInWorld();
     else
       center = target.object->position;
     if (jointMode && jointIsRoot)
     {
        Joint* j = dynamic_cast<Joint*>(target.object);
        if (j != nullptr)
           bounds = j->skeleton->mesh->get_bbox();
     }
     else
       bounds = target.object->get_bbox();
     if (joint != nullptr)
     {
       joint->getAxes(axes);
     }
     else
     {
       axes[0] = Vector3D(1., 0., 0.);
       axes[1] = Vector3D(0., 1., 0.);
       axes[2] = Vector3D(0., 0., 1.);
     }
   } else {
     if (target.element == nullptr) return;
     if (transformedMode) {
       center = target.element->centroid() + target.object->position;
     }
     else {
       center = target.element->centroid();
     }
     bounds = target.element->bounds();
     target.element->getAxes( axes );
   }
}